

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

bool Js::VarIs<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(RecyclableObject *obj)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_0092f0ee;
    *puVar5 = 0;
  }
  TVar1 = ((obj->type).ptr)->typeId;
  if (0x57 < (int)TVar1) {
    BVar4 = RecyclableObject::IsExternal(obj);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_0092f0ee:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return TVar1 == TypeIds_Int64Number;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }